

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

void __thiscall
HighsCliqueTable::runCliqueMerging
          (HighsCliqueTable *this,HighsDomain *globaldomain,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clique,
          bool equation)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  double *pdVar1;
  double dVar2;
  CliqueVar CVar3;
  int iVar4;
  HighsInt HVar5;
  pointer pCVar6;
  pointer pCVar7;
  ulong uVar8;
  long lVar9;
  pointer pCVar10;
  CliqueVar *pCVar11;
  ulong uVar12;
  pointer pdVar13;
  pointer pdVar14;
  const_iterator __cbeg;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  CliqueVar unaff_R13D;
  long lVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  vector<int,_std::allocator<int>_> neighbourhoodInds;
  anon_class_24_3_c8bba91f addCands;
  anon_class_8_1_9cafd1bc local_70;
  vector<int,_std::allocator<int>_> local_68;
  anon_class_24_3_c8bba91f local_48;
  
  this_00 = &this->iscandidate;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (this_00,(long)(this->invertedHashList).
                           super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->invertedHashList).
                           super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (&local_68,
             (long)(this->invertedHashList).
                   super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->invertedHashList).
                   super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  pCVar6 = (clique->
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar7 = (clique->
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar12 = (long)pCVar7 - (long)pCVar6;
  uVar17 = (long)uVar12 >> 2;
  iVar15 = (int)uVar17;
  if (iVar15 != 0) {
    iVar16 = 0x7fffffff;
    uVar18 = 0;
    do {
      uVar21 = (uint)(this->cliqueentries).
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar18] & 0x7fffffff;
      dVar2 = (globaldomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start[uVar21];
      pdVar1 = (globaldomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar21;
      if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
        CVar3 = pCVar6[uVar18];
        iVar4 = (this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(int)((int)CVar3 << 1 | (uint)((int)CVar3 < 0))];
        if (iVar4 < iVar16) {
          iVar16 = iVar4;
          unaff_R13D = CVar3;
        }
      }
      uVar18 = uVar18 + 1;
    } while ((uVar17 & 0xffffffff) != uVar18);
    if (iVar16 != 0x7fffffff) {
      if (iVar15 != 0) {
        uVar18 = 0;
        do {
          CVar3 = (clique->
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar18];
          (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[(int)((int)CVar3 << 1 | (uint)((int)CVar3 < 0))] = '\x01'
          ;
          uVar18 = uVar18 + 1;
        } while ((uVar17 & 0xffffffff) != uVar18);
      }
      uVar21 = (int)unaff_R13D << 1 | (uint)((int)unaff_R13D < 0);
      local_70.addCands = &local_48;
      local_48.this = this;
      local_48.globaldomain = globaldomain;
      local_48.clique = clique;
      HighsHashTree<int,_int>::
      for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:2001:7)_&,_0>
                ((NodePtr)(this->invertedHashList).
                          super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(int)uVar21].root.ptrAndType,
                 &local_70);
      local_70.addCands = &local_48;
      HighsHashTree<int,_void>::
      for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:2004:7)_&,_0>
                ((NodePtr)(this->invertedHashListSizeTwo).
                          super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(int)uVar21].root.ptrAndType,
                 &local_70);
      pCVar7 = (clique->
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pCVar6 = (clique->
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      uVar18 = (ulong)((long)pCVar6 - (long)pCVar7) >> 2;
      if ((int)uVar18 != 0) {
        uVar8 = 0;
        do {
          CVar3 = (clique->
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar8];
          (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[(int)((int)CVar3 << 1 | (uint)((int)CVar3 < 0))] = '\0';
          uVar8 = uVar8 + 1;
        } while ((uVar18 & 0xffffffff) != uVar8);
        pCVar7 = (clique->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pCVar6 = (clique->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      if (iVar15 != 0) {
        uVar18 = 0;
        do {
          iVar16 = (int)((long)pCVar6 - (long)pCVar7 >> 2);
          if (iVar16 <= iVar15) break;
          if (pCVar7[uVar18] != unaff_R13D) {
            HVar5 = shrinkToNeighbourhood
                              (this,&local_68,&this->numNeighbourhoodQueries,pCVar7[uVar18],
                               (CliqueVar *)
                               (&pCVar7->field_0x0 + ((long)(uVar12 * 0x40000000) >> 0x1e)),
                               iVar16 - iVar15);
            pCVar7 = (clique->
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pCVar6 = pCVar7 + (HVar5 + iVar15);
            if (pCVar6 != (clique->
                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          )._M_impl.super__Vector_impl_data._M_finish) {
              (clique->
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              )._M_impl.super__Vector_impl_data._M_finish = pCVar6;
            }
          }
          uVar18 = uVar18 + 1;
        } while ((uVar17 & 0xffffffff) != uVar18);
      }
      uVar17 = (long)(uVar12 * 0x40000000) >> 0x20;
      uVar18 = (long)pCVar6 - (long)pCVar7 >> 2;
      if (uVar17 < uVar18) {
        HighsRandom::shuffle<HighsCliqueTable::CliqueVar>
                  (&this->randgen,pCVar7 + uVar17,(int)uVar18 - iVar15);
        pCVar7 = (clique->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pCVar6 = (clique->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        uVar17 = (ulong)((long)pCVar6 - (long)pCVar7) >> 2;
        if (iVar15 < (int)uVar17) {
          uVar21 = (uint)(uVar12 >> 2);
          lVar20 = (long)(int)uVar21;
          lVar22 = lVar20 * -4;
          lVar19 = (uVar12 & 0xfffffffffffffffc) * 0x40000000;
          uVar21 = ~uVar21;
          lVar23 = lVar20 * 4;
          do {
            lVar19 = lVar19 + 0x100000000;
            HVar5 = shrinkToNeighbourhood
                              (this,&local_68,&this->numNeighbourhoodQueries,pCVar7[lVar20],
                               (CliqueVar *)(&pCVar7[1].field_0x0 + lVar23),(int)uVar17 + uVar21);
            lVar9 = (long)HVar5;
            pCVar7 = (clique->
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if ((pointer)(&pCVar7[lVar9 + 1].field_0x0 + lVar23) !=
                (clique->
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              (clique->
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              )._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)(&pCVar7[lVar9 + 1].field_0x0 + lVar23);
            }
            lVar20 = lVar20 + 1;
            uVar17 = (ulong)(lVar23 + 4 + lVar9 * 4) >> 2;
            lVar22 = lVar22 + -4;
            uVar21 = uVar21 - 1;
            lVar23 = lVar23 + 4;
          } while (lVar20 < (lVar9 << 0x20) + lVar19 >> 0x20);
          pCVar6 = (pointer)((long)pCVar7 + (lVar9 * 4 - lVar22));
        }
      }
      if (equation) {
        if (iVar15 < (int)((ulong)((long)pCVar6 - (long)pCVar7) >> 2)) {
          lVar23 = (long)(int)(uVar12 >> 2);
          do {
            vertexInfeasible(this,globaldomain,(uint)pCVar7[lVar23] & 0x7fffffff,
                             (uint)pCVar7[lVar23] >> 0x1f);
            lVar23 = lVar23 + 1;
            pCVar7 = (clique->
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          } while (lVar23 < (int)((ulong)((long)(clique->
                                                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pCVar7) >> 2));
        }
      }
      else {
        runCliqueSubsumption(this,globaldomain,clique);
        pCVar6 = (clique->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pCVar7 = (clique->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (pCVar6 != pCVar7) {
          uVar12 = (long)pCVar7 - (long)pCVar6;
          if (0 < (long)uVar12 >> 4) {
            pdVar14 = (globaldomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pdVar13 = (globaldomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pCVar10 = (pointer)((long)&pCVar6->field_0x0 + (uVar12 & 0xfffffffffffffff0));
            lVar23 = ((long)uVar12 >> 4) + 1;
            pCVar6 = pCVar6 + 2;
            do {
              uVar21 = (uint)pCVar6[-2] & 0x7fffffff;
              dVar2 = pdVar14[uVar21];
              if (((dVar2 == pdVar13[uVar21]) && (!NAN(dVar2) && !NAN(pdVar13[uVar21]))) &&
                 ((int)dVar2 == ~(uint)pCVar6[-2] >> 0x1f)) {
                pCVar6 = pCVar6 + -2;
                goto LAB_002628ed;
              }
              uVar21 = (uint)pCVar6[-1] & 0x7fffffff;
              dVar2 = pdVar14[uVar21];
              if (((dVar2 == pdVar13[uVar21]) && (!NAN(dVar2) && !NAN(pdVar13[uVar21]))) &&
                 ((int)dVar2 == ~(uint)pCVar6[-1] >> 0x1f)) {
                pCVar6 = pCVar6 + -1;
                goto LAB_002628ed;
              }
              uVar21 = (uint)*pCVar6 & 0x7fffffff;
              dVar2 = pdVar14[uVar21];
              if (((dVar2 == pdVar13[uVar21]) && (!NAN(dVar2) && !NAN(pdVar13[uVar21]))) &&
                 ((int)dVar2 == ~(uint)*pCVar6 >> 0x1f)) goto LAB_002628ed;
              uVar21 = (uint)pCVar6[1] & 0x7fffffff;
              dVar2 = pdVar14[uVar21];
              if (((dVar2 == pdVar13[uVar21]) && (!NAN(dVar2) && !NAN(pdVar13[uVar21]))) &&
                 ((int)dVar2 == ~(uint)pCVar6[1] >> 0x1f)) {
                pCVar6 = pCVar6 + 1;
                goto LAB_002628ed;
              }
              lVar23 = lVar23 + -1;
              pCVar6 = pCVar6 + 4;
            } while (1 < lVar23);
            uVar12 = (long)pCVar7 - (long)pCVar10;
            pCVar6 = pCVar10;
          }
          lVar23 = (long)uVar12 >> 2;
          if (lVar23 == 3) {
            pdVar14 = (globaldomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pdVar13 = (globaldomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar21 = (uint)*pCVar6 & 0x7fffffff;
            dVar2 = pdVar14[uVar21];
            if (((dVar2 != pdVar13[uVar21]) || (NAN(dVar2) || NAN(pdVar13[uVar21]))) ||
               ((int)dVar2 != ~(uint)*pCVar6 >> 0x1f)) {
              pCVar6 = pCVar6 + 1;
              goto LAB_00262886;
            }
          }
          else {
            if (lVar23 == 2) {
              pdVar14 = (globaldomain->col_lower_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar13 = (globaldomain->col_upper_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
LAB_00262886:
              uVar21 = (uint)*pCVar6 & 0x7fffffff;
              dVar2 = pdVar14[uVar21];
              if (((dVar2 == pdVar13[uVar21]) && (!NAN(dVar2) && !NAN(pdVar13[uVar21]))) &&
                 ((int)dVar2 == ~(uint)*pCVar6 >> 0x1f)) goto LAB_002628ed;
              pCVar6 = pCVar6 + 1;
            }
            else {
              if (lVar23 != 1) goto LAB_00262952;
              pdVar14 = (globaldomain->col_lower_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar13 = (globaldomain->col_upper_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
            }
            uVar21 = (uint)*pCVar6 & 0x7fffffff;
            dVar2 = pdVar14[uVar21];
            if ((int)dVar2 != ~(uint)*pCVar6 >> 0x1f) {
              pCVar6 = pCVar7;
            }
            if (dVar2 != pdVar13[uVar21]) {
              pCVar6 = pCVar7;
            }
            if (NAN(dVar2) || NAN(pdVar13[uVar21])) {
              pCVar6 = pCVar7;
            }
          }
LAB_002628ed:
          if (pCVar6 != pCVar7) {
            pCVar11 = pCVar6 + 1;
            if (pCVar11 != pCVar7) {
              do {
                CVar3 = *pCVar11;
                dVar2 = (globaldomain->col_lower_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[(uint)CVar3 & 0x7fffffff];
                pdVar1 = (globaldomain->col_upper_).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + ((uint)CVar3 & 0x7fffffff);
                if (((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) ||
                   ((int)dVar2 != ~(uint)CVar3 >> 0x1f)) {
                  *pCVar6 = CVar3;
                  pCVar6 = pCVar6 + 1;
                }
                pCVar11 = pCVar11 + 1;
              } while (pCVar11 != pCVar7);
              pCVar7 = (clique->
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            }
            if (pCVar6 != pCVar7) {
              (clique->
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              )._M_impl.super__Vector_impl_data._M_finish = pCVar6;
            }
          }
        }
      }
LAB_00262952:
      processInfeasibleVertices(this,globaldomain);
      goto LAB_0026295d;
    }
  }
  if (pCVar7 != pCVar6) {
    (clique->
    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>).
    _M_impl.super__Vector_impl_data._M_finish = pCVar6;
  }
LAB_0026295d:
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsCliqueTable::runCliqueMerging(HighsDomain& globaldomain,
                                        std::vector<CliqueVar>& clique,
                                        bool equation) {
  CliqueVar extensionstart;
  HighsInt numcliques = kHighsIInf;
  iscandidate.resize(invertedHashList.size());
  std::vector<HighsInt> neighbourhoodInds;
  neighbourhoodInds.reserve(invertedHashList.size());

  HighsInt initialCliqueSize = clique.size();
  for (HighsInt i = 0; i != initialCliqueSize; ++i) {
    if (globaldomain.isFixed(cliqueentries[i].col)) continue;

    HighsInt thisNumClqs = numCliques(clique[i]);
    if (thisNumClqs < numcliques) {
      numcliques = thisNumClqs;
      extensionstart = clique[i];
    }
  }

  if (numcliques == kHighsIInf) {
    clique.clear();
    return;
  }

  for (HighsInt i = 0; i != initialCliqueSize; ++i)
    iscandidate[clique[i].index()] = true;

  auto addCands = [&](HighsInt cliqueid) {
    HighsInt start = cliques[cliqueid].start;
    HighsInt end = cliques[cliqueid].end;

    for (HighsInt i = start; i != end; ++i) {
      if (iscandidate[cliqueentries[i].index()] ||
          globaldomain.isFixed(cliqueentries[i].col))
        continue;

      iscandidate[cliqueentries[i].index()] = true;
      clique.push_back(cliqueentries[i]);
    }
  };

  invertedHashList[extensionstart.index()].for_each(
      [&](HighsInt cliqueid) { addCands(cliqueid); });

  invertedHashListSizeTwo[extensionstart.index()].for_each(
      [&](HighsInt cliqueid) { addCands(cliqueid); });

  HighsInt sizeWithCandidates = clique.size();
  for (HighsInt i = 0; i != sizeWithCandidates; ++i)
    iscandidate[clique[i].index()] = false;

  for (HighsInt i = 0;
       i != initialCliqueSize && initialCliqueSize < (HighsInt)clique.size();
       ++i) {
    if (clique[i] == extensionstart) continue;

    HighsInt newSize =
        initialCliqueSize +
        shrinkToNeighbourhood(neighbourhoodInds, numNeighbourhoodQueries,
                              clique[i], clique.data() + initialCliqueSize,
                              clique.size() - initialCliqueSize);
    clique.erase(clique.begin() + newSize, clique.end());
  }

  if (static_cast<size_t>(initialCliqueSize) < clique.size()) {
    // todo, shuffle extension vars?
    randgen.shuffle(clique.data() + initialCliqueSize,
                    clique.size() - initialCliqueSize);
    HighsInt i = initialCliqueSize;
    while (i < (HighsInt)clique.size()) {
      CliqueVar extvar = clique[i];
      i += 1;

      HighsInt newSize = i + shrinkToNeighbourhood(
                                 neighbourhoodInds, numNeighbourhoodQueries,
                                 extvar, clique.data() + i, clique.size() - i);
      clique.erase(clique.begin() + newSize, clique.end());
    }
  }

  if (equation) {
    for (HighsInt i = initialCliqueSize; i < (HighsInt)clique.size(); ++i)
      vertexInfeasible(globaldomain, clique[i].col, clique[i].val);
  } else {
    runCliqueSubsumption(globaldomain, clique);

    if (!clique.empty()) {
      clique.erase(
          std::remove_if(clique.begin(), clique.end(),
                         [&](CliqueVar v) {
                           return globaldomain.isFixed(v.col) &&
                                  static_cast<int>(
                                      globaldomain.col_lower_[v.col]) ==
                                      static_cast<int>(1 - v.val);
                         }),
          clique.end());
    }
  }

  processInfeasibleVertices(globaldomain);
}